

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.h
# Opt level: O2

void __thiscall r_exec::ObjectValue::~ObjectValue(ObjectValue *this)

{
  ~ObjectValue(this);
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT ObjectValue:
    public BoundValue
{
private:
    const core::P<r_code::Code> object;
public:
    ObjectValue(BindingMap *map, r_code::Code *object);

    Value *copy(BindingMap *map) const;
    void valuate(r_code::Code *destination, uint16_t write_index, uint16_t &extent_index) const;
    bool match(const r_code::Code *object, uint16_t index);
    r_code::Atom *get_code();
    r_code::Code *get_object();
    uint16_t get_code_size();

    bool intersect(const Value *v) const;
    bool _intersect(const ObjectValue *v) const;

    bool contains(const r_code::Code *o) const;
}